

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentQLearner.cpp
# Opt level: O1

double __thiscall
AgentQLearner::getMaxState
          (AgentQLearner *this,Index sI,list<unsigned_int,_std::allocator<unsigned_int>_> *actions)

{
  size_t *psVar1;
  ulong uVar2;
  _List_node_base *p_Var3;
  ulong uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (actions != (list<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::clear(actions);
  }
  uVar2 = *(ulong *)&(this->super_AgentFullyObservable).field_0x18;
  if (uVar2 == 0) {
    dVar7 = -1.79769313486232e+308;
  }
  else {
    uVar4 = 0;
    auVar8 = ZEXT1664(ZEXT816(0xffefffffffffffff));
    do {
      dVar7 = *(double *)(uVar2 * sI * 8 + *(long *)&this->field_0x30 + uVar4 * 8);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar7;
      dVar6 = auVar8._0_8_;
      auVar5._8_8_ = 0x7fffffffffffffff;
      auVar5._0_8_ = 0x7fffffffffffffff;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar7 - dVar6;
      auVar5 = vandpd_avx512vl(auVar9,auVar5);
      if (1e-09 <= auVar5._0_8_) {
        auVar5 = vmaxsd_avx(auVar10,auVar8._0_16_);
        if (actions == (list<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          auVar8 = ZEXT1664(auVar5);
        }
        else {
          auVar8 = ZEXT1664(auVar5);
          if (dVar6 < dVar7) {
            std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::clear(actions);
            goto LAB_0039c784;
          }
        }
      }
      else {
        dVar7 = dVar6;
        if (actions != (list<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
LAB_0039c784:
          p_Var3 = (_List_node_base *)operator_new(0x18);
          *(int *)&p_Var3[1]._M_next = (int)uVar4;
          std::__detail::_List_node_base::_M_hook(p_Var3);
          auVar8 = ZEXT864((ulong)dVar7);
          psVar1 = &(actions->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                    ._M_node._M_size;
          *psVar1 = *psVar1 + 1;
        }
      }
      dVar7 = auVar8._0_8_;
      uVar4 = (ulong)((int)uVar4 + 1);
      uVar2 = *(ulong *)&(this->super_AgentFullyObservable).field_0x18;
    } while (uVar4 < uVar2);
  }
  return dVar7;
}

Assistant:

double AgentQLearner::getMaxState(Index sI, list<Index>* actions) const
{
    if(actions)
        actions->clear();

    double dMax = -DBL_MAX;

    row_t row = _m_Q.GetRow(sI); // Q values for a specific state

    for(unsigned j = 0; j < row.size(); ++j)
    {
        if( std::abs( row(j) - dMax ) < EPSILON )
        {
            if(actions)
                actions->push_back(j);
        }
        else if( row(j) > dMax )
        {
            dMax = row(j);
            if(actions)
            {
                actions->clear();
                actions->push_back(j);
            }
        }
    }

    return dMax;
}